

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_value.c
# Opt level: O0

void * metacall_value_cast_future(void **v)

{
  type_id tVar1;
  future pfVar2;
  undefined8 *in_RDI;
  value unaff_retaddr;
  value v_cast;
  type_id in_stack_00000064;
  value in_stack_00000068;
  value in_stack_fffffffffffffff0;
  
  tVar1 = value_type_id(unaff_retaddr);
  if ((tVar1 != 0xc) &&
     (in_stack_fffffffffffffff0 = value_type_cast(in_stack_00000068,in_stack_00000064),
     in_stack_fffffffffffffff0 != (value)0x0)) {
    *in_RDI = in_stack_fffffffffffffff0;
  }
  pfVar2 = value_to_future(in_stack_fffffffffffffff0);
  return pfVar2;
}

Assistant:

void *metacall_value_cast_future(void **v)
{
	if (value_type_id(*v) != TYPE_FUTURE)
	{
		value v_cast = value_type_cast(*v, TYPE_FUTURE);

		if (v_cast != NULL)
		{
			*v = v_cast;
		}
	}

	return value_to_future(*v);
}